

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O1

TextureLevelPyramid * __thiscall
tcu::TextureLevelPyramid::operator=(TextureLevelPyramid *this,TextureLevelPyramid *other)

{
  vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  *this_00;
  vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *this_01;
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  pointer pAVar5;
  undefined8 uVar6;
  TextureFormat format;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  pointer pPVar11;
  
  if (this != other) {
    this->m_format = other->m_format;
    this_00 = &this->m_data;
    std::
    vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
    ::resize(this_00,(long)((int)((ulong)((long)(other->m_access).
                                                super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(other->m_access).
                                               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                           -0x33333333));
    this_01 = &this->m_access;
    std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::resize
              (this_01,(long)((int)((ulong)((long)(other->m_access).
                                                  super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)(other->m_access).
                                                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                             -0x33333333));
    pPVar11 = (other->m_access).
              super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(other->m_access).
                                super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar11) >> 3) *
            -0x33333333) {
      lVar9 = 0;
      lVar8 = 0;
      lVar10 = 0;
      do {
        pAVar5 = (other->m_data).
                 super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (*(long *)((long)&pAVar5->m_cap + lVar8) == 0) {
          pAVar5 = (this_00->
                   super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if (*(long *)((long)&pAVar5->m_cap + lVar8) != 0) {
            de::ArrayBuffer<unsigned_char,_1UL,_1UL>::clear
                      ((ArrayBuffer<unsigned_char,_1UL,_1UL> *)((long)&pAVar5->m_ptr + lVar8));
            pPVar11 = (this_01->
                      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            *(undefined8 *)
             ((long)(pPVar11->super_ConstPixelBufferAccess).m_size.m_data + lVar9 + -8) =
                 0x2600000015;
            puVar1 = (undefined8 *)
                     ((long)(pPVar11->super_ConstPixelBufferAccess).m_size.m_data + lVar9);
            *puVar1 = 0;
            puVar1[1] = 0;
            puVar1 = (undefined8 *)
                     ((long)(pPVar11->super_ConstPixelBufferAccess).m_pitch.m_data + lVar9 + 4U);
            *puVar1 = 0;
            puVar1[1] = 0;
          }
        }
        else {
          de::ArrayBuffer<unsigned_char,_1UL,_1UL>::operator=
                    ((ArrayBuffer<unsigned_char,_1UL,_1UL> *)
                     ((long)&((this_00->
                              super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                              )._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar8),
                     (ArrayBuffer<unsigned_char,_1UL,_1UL> *)((long)&pAVar5->m_ptr + lVar8));
          iVar2 = *(int *)((long)(pPVar11->super_ConstPixelBufferAccess).m_size.m_data + lVar9);
          iVar3 = *(int *)((long)(pPVar11->super_ConstPixelBufferAccess).m_size.m_data + lVar9 + 4U)
          ;
          uVar4 = *(undefined4 *)
                   ((long)(pPVar11->super_ConstPixelBufferAccess).m_size.m_data + lVar9 + 8U);
          uVar6 = *(undefined8 *)
                   ((long)&((this_00->
                            super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar8);
          format = *(TextureFormat *)
                    ((long)(pPVar11->super_ConstPixelBufferAccess).m_size.m_data + lVar9 + -8);
          iVar7 = getPixelSize(format);
          pPVar11 = (this_01->
                    super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          *(TextureFormat *)
           ((long)(pPVar11->super_ConstPixelBufferAccess).m_size.m_data + lVar9 + -8) = format;
          *(int *)((long)(pPVar11->super_ConstPixelBufferAccess).m_size.m_data + lVar9) = iVar2;
          *(int *)((long)(pPVar11->super_ConstPixelBufferAccess).m_size.m_data + lVar9 + 4U) = iVar3
          ;
          *(undefined4 *)((long)(pPVar11->super_ConstPixelBufferAccess).m_size.m_data + lVar9 + 8U)
               = uVar4;
          *(int *)((long)(pPVar11->super_ConstPixelBufferAccess).m_pitch.m_data + lVar9) = iVar7;
          iVar7 = iVar7 * iVar2;
          *(int *)((long)(pPVar11->super_ConstPixelBufferAccess).m_pitch.m_data + lVar9 + 4U) =
               iVar7;
          *(int *)((long)(pPVar11->super_ConstPixelBufferAccess).m_pitch.m_data + lVar9 + 8U) =
               iVar7 * iVar3;
          *(undefined8 *)((long)(&(pPVar11->super_ConstPixelBufferAccess).m_pitch + 1) + lVar9) =
               uVar6;
        }
        lVar10 = lVar10 + 1;
        pPVar11 = (other->m_access).
                  super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar8 = lVar8 + 0x10;
        lVar9 = lVar9 + 0x28;
      } while (lVar10 < (int)((ulong)((long)(other->m_access).
                                            super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pPVar11) >> 3) * -0x33333333);
    }
  }
  return this;
}

Assistant:

TextureLevelPyramid& TextureLevelPyramid::operator= (const TextureLevelPyramid& other)
{
	if (this == &other)
		return *this;

	m_format = other.m_format;
	m_data.resize(other.getNumLevels());
	m_access.resize(other.getNumLevels());

	for (int levelNdx = 0; levelNdx < other.getNumLevels(); levelNdx++)
	{
		if (!other.isLevelEmpty(levelNdx))
		{
			const tcu::ConstPixelBufferAccess& srcLevel = other.getLevel(levelNdx);

			m_data[levelNdx] = other.m_data[levelNdx];
			m_access[levelNdx] = PixelBufferAccess(srcLevel.getFormat(), srcLevel.getWidth(), srcLevel.getHeight(), srcLevel.getDepth(), m_data[levelNdx].getPtr());
		}
		else if (!isLevelEmpty(levelNdx))
			clearLevel(levelNdx);
	}

	return *this;
}